

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

void __thiscall
glslang::TSymbolValidater::operator()
          (TSymbolValidater *this,
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          *entKey)

{
  EShLanguage language;
  TIntermSymbol *pTVar1;
  TVarLiveMap *pTVar2;
  size_type sVar3;
  size_type sVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar9;
  undefined4 extraout_var_03;
  long lVar10;
  long *plVar11;
  _Rb_tree_node_base *p_Var12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  iterator iVar13;
  TType *pTVar14;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar15;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  bool *pbVar16;
  undefined4 extraout_var_14;
  TType *pTVar17;
  TQualifier *pTVar18;
  TType *pTVar19;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TTypeList *pTVar20;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  ulong uVar21;
  size_type sVar22;
  EShLanguage language_00;
  undefined8 uVar23;
  char *__lhs;
  _Alloc_hider _Var24;
  long lVar25;
  EShLanguage language_01;
  _Self __tmp;
  uint uVar26;
  ulong uVar27;
  TString mangleName2;
  TString mangleName1;
  TString err_4;
  TType subType;
  allocator<char> local_18a;
  allocator<char> local_189;
  TType *local_188;
  TString local_180;
  TString local_158;
  string local_130;
  undefined1 local_110 [16];
  undefined1 local_100 [24];
  undefined1 local_e8 [16];
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_d0 [8];
  string local_50;
  
  pTVar1 = (entKey->second).symbol;
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar1);
  local_188 = (TType *)CONCAT44(extraout_var,iVar7);
  local_158._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_180._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  pTVar14 = local_188;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  language = (entKey->second).stage;
  language_00 = language;
  uVar21 = (ulong)language;
  do {
    uVar21 = uVar21 - 1;
    if ((int)language_00 < 1) {
      language_00 = EShLangCount;
      break;
    }
    language_00 = language_00 - EShLangTessControl;
  } while (this->inVarMaps[uVar21 & 0xffffffff] == (TVarLiveMap *)0x0);
  uVar21 = 0xd;
  if (0xd < (int)language) {
    uVar21 = (ulong)language;
  }
  lVar10 = 0;
  do {
    if (uVar21 - (long)(int)language == lVar10) {
      language_01 = EShLangCount;
      goto LAB_003f7b30;
    }
    lVar25 = lVar10 + 1;
    lVar15 = lVar10 + 1;
    lVar10 = lVar25;
  } while (this->inVarMaps[(int)language + lVar15] == (TVarLiveMap *)0x0);
  language_01 = (int)lVar25 + language;
LAB_003f7b30:
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  iVar7 = (*local_188->_vptr_TType[0xb])(local_188);
  bVar5 = TQualifier::isArrayedIo((TQualifier *)CONCAT44(extraout_var_00,iVar7),language);
  if (bVar5) {
    TType::TType((TType *)local_e8,pTVar14,0,false);
    TType::buildMangledName((TType *)local_e8,&local_158);
  }
  else {
    TType::buildMangledName(pTVar14,&local_158);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  push_back(&local_158,';');
  iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
  if ((*(uint *)(CONCAT44(extraout_var_01,iVar7) + 8) & 0x7f) == 3) {
    if (language_00 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    if (CONCAT44(extraout_var_02,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->outVarMaps[language_00]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
            ::find(&this->outVarMaps[language_00]->_M_t,&entKey->first);
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x58))
                       ((long *)CONCAT44(extraout_var_03,iVar7));
    iVar13 = iVar9;
    if (((_Rb_tree_header *)iVar9._M_node ==
         &(this->outVarMaps[language_00]->_M_t)._M_impl.super__Rb_tree_header) &&
       (uVar26 = *(uint *)(lVar10 + 0x1c) & 0xfff, uVar26 != 0xfff)) {
      for (p_Var12 = (this->outVarMaps[language_00]->_M_t)._M_impl.super__Rb_tree_header._M_header.
                     _M_left; iVar13 = iVar9, p_Var12 != iVar9._M_node;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        plVar11 = (long *)(**(code **)(*(long *)p_Var12[2]._M_left + 0xf0))();
        lVar10 = (**(code **)(*plVar11 + 0x58))(plVar11);
        iVar13._M_node = p_Var12;
        if ((*(uint *)(lVar10 + 0x1c) & 0xfff) == uVar26) break;
      }
    }
    pTVar2 = this->outVarMaps[language_00];
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pTVar14 = (TType *)CONCAT44(extraout_var_14,iVar7);
    if ((_Rb_tree_header *)iVar13._M_node == &(pTVar2->_M_t)._M_impl.super__Rb_tree_header) {
      iVar7 = (*pTVar14->_vptr_TType[0x29])();
      if ((char)iVar7 != '\0') {
        return;
      }
      if (this->profile != EEsProfile) {
        return;
      }
      if ((entKey->second).live != true) {
        return;
      }
      *this->hadError = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     local_e8,&entKey->first,
                     ": not been declare as a output variable in pre shader stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,(char *)local_e8._8_8_);
      return;
    }
    pTVar17 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    if (*this->hadError == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_110,(entKey->first)._M_dataplus._M_p,(allocator<char> *)&local_130)
      ;
      bVar5 = typeCheck(this,pTVar14,pTVar17,(string *)local_110,false);
      *this->hadError = bVar5;
      if ((TPoolAllocator *)local_110._0_8_ != (TPoolAllocator *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,local_100._0_8_ + 1);
      }
    }
    else {
      *this->hadError = true;
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    pTVar18 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar18,language_00);
    if (bVar5) {
      pTVar19 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      TType::TType((TType *)local_e8,pTVar19,0,false);
      TType::buildMangledName((TType *)local_e8,&local_180);
    }
    else {
      pTVar19 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      TType::buildMangledName(pTVar19,&local_180);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(&local_180,';');
    sVar4 = local_158._M_string_length;
    sVar3 = local_180._M_string_length;
    sVar22 = local_158._M_string_length;
    if (local_180._M_string_length < local_158._M_string_length) {
      sVar22 = local_180._M_string_length;
    }
    if (sVar22 == 0) {
      bVar5 = true;
    }
    else {
      iVar7 = bcmp(local_158._M_dataplus._M_p,local_180._M_dataplus._M_p,sVar22);
      bVar5 = iVar7 == 0;
    }
    if (!(bool)(bVar5 ^ 1U | sVar4 != sVar3)) {
      if (this->profile != EEsProfile) {
        return;
      }
      if (this->version != 300) {
        return;
      }
      if ((entKey->second).stage != EShLangFragment) {
        return;
      }
      iVar7 = (*pTVar14->_vptr_TType[0x29])(pTVar14);
      if ((char)iVar7 != '\0') {
        return;
      }
      iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
      iVar7 = *(int *)(CONCAT44(extraout_var_15,iVar7) + 8);
      iVar8 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
      if (iVar7 < 0 != ((*(byte *)(CONCAT44(extraout_var_16,iVar8) + 0xb) & 0x80) == 0)) {
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        uVar21 = *(ulong *)(CONCAT44(extraout_var_17,iVar7) + 8);
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_18,iVar7) + 8)) >> 0x25 & 1) == 0) {
          return;
        }
      }
      __lhs = "Interpolation qualifier mismatch : ";
      goto LAB_003f8661;
    }
    iVar7 = (*pTVar14->_vptr_TType[7])(pTVar14);
    if (((iVar7 == 0x10) && (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 != '\0'))
       && (iVar7 = (*pTVar17->_vptr_TType[0x25])(pTVar17), (char)iVar7 == '\0')) {
      local_e8._0_8_ = GetThreadPoolAllocator();
      local_d8 = (char *)0x0;
      local_d0[0]._M_local_buf[0] = '\0';
      local_e8._8_8_ = local_d0;
      pTVar20 = TType::getStruct(pTVar14);
      TType::buildMangledName
                (((pTVar20->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_e8,';');
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_e8,&local_180);
      if (iVar7 == 0) {
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        uVar26 = *(uint *)(CONCAT44(extraout_var_19,iVar7) + 0x1c);
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        if (((uVar26 ^ *(uint *)(CONCAT44(extraout_var_20,iVar7) + 0x1c)) & 0xfff) == 0) {
          return;
        }
      }
    }
    iVar7 = (*pTVar17->_vptr_TType[7])(pTVar17);
    if (((iVar7 == 0x10) && (iVar7 = (*pTVar17->_vptr_TType[0x25])(pTVar17), (char)iVar7 != '\0'))
       && (iVar7 = (*pTVar14->_vptr_TType[0x25])(pTVar14), (char)iVar7 == '\0')) {
      local_e8._0_8_ = GetThreadPoolAllocator();
      local_d8 = (char *)0x0;
      local_d0[0]._M_local_buf[0] = '\0';
      local_e8._8_8_ = local_d0;
      pTVar20 = TType::getStruct(pTVar17);
      TType::buildMangledName
                (((pTVar20->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_start)->type,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_e8,';');
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)local_e8,&local_158);
      if (iVar7 == 0) {
        iVar7 = (*pTVar14->_vptr_TType[0xb])(pTVar14);
        uVar26 = *(uint *)(CONCAT44(extraout_var_21,iVar7) + 0x1c);
        iVar7 = (*pTVar17->_vptr_TType[0xb])(pTVar17);
        uVar26 = (uVar26 ^ *(uint *)(CONCAT44(extraout_var_22,iVar7) + 0x1c)) & 0xfff;
        goto joined_r0x003f8658;
      }
    }
  }
  else {
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
    if ((*(uint *)(CONCAT44(extraout_var_04,iVar7) + 8) & 0x7f) != 4) {
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar1);
      if (1 < (*(uint *)(CONCAT44(extraout_var_06,iVar7) + 8) & 0x7f) - 5) {
        return;
      }
      iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      if (*(char *)(CONCAT44(extraout_var_07,iVar7) + 0x2d) != '\0') {
        return;
      }
      uVar21 = 0;
      do {
        if ((uVar21 != language) && (this->outVarMaps[uVar21] != (TVarLiveMap *)0x0)) {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&this->uniformVarMap[uVar21]->_M_t,&entKey->first);
          if ((_Rb_tree_header *)iVar13._M_node ==
              &(this->uniformVarMap[uVar21]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
            if (iVar7 == 0x10) {
              iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)CONCAT44(extraout_var_08,iVar7),0,5,"anon@");
              if (iVar7 == 0) {
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
                plVar11 = (long *)CONCAT44(extraout_var_09,iVar7);
                cVar6 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar6 == '\0') {
                  __assert_fail("isStruct()",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
                }
                lVar10 = plVar11[0xd];
                if (*(long *)(lVar10 + 0x10) != *(long *)(lVar10 + 8)) {
                  lVar25 = 0;
                  uVar27 = 0;
                  do {
                    lVar15 = (**(code **)(**(long **)(*(long *)(lVar10 + 8) + lVar25) + 0x30))();
                    local_e8._0_8_ = GetThreadPoolAllocator();
                    local_e8._8_8_ = local_d0;
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                         *)local_e8,*(long *)(lVar15 + 8),
                                        *(long *)(lVar15 + 0x10) + *(long *)(lVar15 + 8));
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                             ::find(&this->uniformVarMap[uVar21]->_M_t,(key_type *)local_e8);
                    if ((_Rb_tree_header *)iVar13._M_node !=
                        &(this->uniformVarMap[uVar21]->_M_t)._M_impl.super__Rb_tree_header) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)local_110,"Invalid Uniform variable name : ",
                                     (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                      *)local_e8);
                      TInfoSinkBase::message
                                (&this->infoSink->info,EPrefixInternalError,(char *)local_110._8_8_)
                      ;
                      *this->hadError = true;
                      break;
                    }
                    uVar27 = uVar27 + 1;
                    lVar25 = lVar25 + 0x20;
                  } while (uVar27 < (ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8) >> 5));
                }
              }
            }
          }
          else {
            pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
            TType::buildMangledName(pTVar14,&local_180);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::push_back(&local_180,';');
            sVar4 = local_158._M_string_length;
            sVar3 = local_180._M_string_length;
            sVar22 = local_158._M_string_length;
            if (local_180._M_string_length < local_158._M_string_length) {
              sVar22 = local_180._M_string_length;
            }
            if (sVar22 == 0) {
              bVar5 = true;
            }
            else {
              iVar7 = bcmp(local_158._M_dataplus._M_p,local_180._M_dataplus._M_p,sVar22);
              bVar5 = iVar7 == 0;
            }
            pTVar14 = local_188;
            if (!(bool)(bVar5 & sVar4 == sVar3)) {
              pTVar17 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
              if (pTVar14->field_0x8 == pTVar17->field_0x8) {
                TType::sameElementShape(pTVar17,pTVar14,(int *)0x0,(int *)0x0);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_e8,"Invalid Uniform variable type : ",&entKey->first);
              TInfoSinkBase::message
                        (&this->infoSink->info,EPrefixInternalError,(char *)local_e8._8_8_);
              *this->hadError = true;
            }
            local_180._M_string_length = 0;
            *local_180._M_dataplus._M_p = '\0';
            if (*this->hadError == false) {
              iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar1);
              iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar7) + 0x38))
                                ((long *)CONCAT44(extraout_var_10,iVar7));
              if (iVar7 == 0x10) {
                iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                  (pTVar1);
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_11,iVar7),0,5,"anon@");
                this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 400))();
                iVar8 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(this_00,0,5,"anon@");
                if ((iVar7 == 0) != (iVar8 == 0)) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)local_e8,
                                 "Matched uniform block names must also either all be lacking an instance name or all having an instance name: "
                                 ,&entKey->first);
                  TInfoSinkBase::message
                            (&this->infoSink->info,EPrefixInternalError,(char *)local_e8._8_8_);
                  *this->hadError = true;
                }
              }
            }
            iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar1);
            pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
            if (*this->hadError == false) {
              iVar8 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (pTVar1);
              iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar8) + 0x38))
                                ((long *)CONCAT44(extraout_var_13,iVar8));
              if (iVar8 != 0x10) goto LAB_003f8149;
              pbVar16 = this->hadError;
              if (*pbVar16 != false) goto LAB_003f8158;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_130,(entKey->first)._M_dataplus._M_p,&local_189);
              bVar5 = typeCheck(this,(TType *)CONCAT44(extraout_var_12,iVar7),pTVar14,&local_130,
                                true);
              *this->hadError = bVar5;
              uVar23 = local_130.field_2._M_allocated_capacity;
              _Var24._M_p = local_130._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_003f81bf;
LAB_003f81b4:
              operator_delete(_Var24._M_p,uVar23 + 1);
            }
            else {
LAB_003f8149:
              pbVar16 = this->hadError;
              if (*pbVar16 == false) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_50,(entKey->first)._M_dataplus._M_p,&local_18a);
                bVar5 = typeCheck(this,(TType *)CONCAT44(extraout_var_12,iVar7),pTVar14,&local_50,
                                  false);
                *this->hadError = bVar5;
                uVar23 = local_50.field_2._M_allocated_capacity;
                _Var24._M_p = local_50._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_003f81b4;
              }
              else {
LAB_003f8158:
                *pbVar16 = true;
              }
            }
          }
        }
LAB_003f81bf:
        uVar21 = uVar21 + 1;
        if (uVar21 == 0xe) {
          return;
        }
      } while( true );
    }
    if (language_01 == EShLangCount) {
      return;
    }
    iVar7 = (*(pTVar1->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    if (CONCAT44(extraout_var_05,iVar7) < 0x300000000000000) {
      return;
    }
    if (&this->inVarMaps[language_01]->_M_t ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
         *)0x0) {
      return;
    }
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
             ::find(&this->inVarMaps[language_01]->_M_t,&entKey->first);
    if ((_Rb_tree_header *)iVar13._M_node ==
        &(this->inVarMaps[language_01]->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    plVar11 = (long *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
    pTVar18 = (TQualifier *)(**(code **)(*plVar11 + 0x58))(plVar11);
    bVar5 = TQualifier::isArrayedIo(pTVar18,language_01);
    if (bVar5) {
      pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      TType::TType((TType *)local_e8,pTVar14,0,false);
      TType::buildMangledName((TType *)local_e8,&local_180);
    }
    else {
      pTVar14 = (TType *)(**(code **)(*(long *)iVar13._M_node[2]._M_left + 0xf0))();
      TType::buildMangledName(pTVar14,&local_180);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    push_back(&local_180,';');
    uVar26 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       (&local_158,&local_180);
joined_r0x003f8658:
    if (uVar26 == 0) {
      return;
    }
  }
  __lhs = "Invalid In/Out variable type : ";
LAB_003f8661:
  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_e8,__lhs,&entKey->first);
  TInfoSinkBase::message(&this->infoSink->info,EPrefixInternalError,(char *)local_e8._8_8_);
  *this->hadError = true;
  return;
}

Assistant:

inline void operator()(std::pair<const TString, TVarEntryInfo>& entKey) {
        TVarEntryInfo& ent1 = entKey.second;
        TIntermSymbol* base = ent1.symbol;
        const TType& type = ent1.symbol->getType();
        const TString& name = entKey.first;
        TString mangleName1, mangleName2;
        EShLanguage stage = ent1.stage;
        EShLanguage preStage, currentStage, nextStage;

        preStage = EShLangCount;
        for (int i = stage - 1; i >= 0; i--) {
            if (inVarMaps[i] != nullptr) {
                preStage = static_cast<EShLanguage>(i);
                break;
            }
        }
        currentStage = stage;
        nextStage = EShLangCount;
        for (int i = stage + 1; i < EShLangCount; i++) {
            if (inVarMaps[i] != nullptr) {
                nextStage = static_cast<EShLanguage>(i);
                break;
            }
        }

        if (type.getQualifier().isArrayedIo(stage)) {
            TType subType(type, 0);
            subType.appendMangledName(mangleName1);
        } else {
            type.appendMangledName(mangleName1);
        }


        // basic checking that symbols match
        // more extensive checking in the link stage
        if (base->getQualifier().storage == EvqVaryingIn) {
            // validate stage in;
            if (preStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (outVarMaps[preStage] != nullptr) {
                auto ent2 = outVarMaps[preStage]->find(name);
                uint32_t location = base->getType().getQualifier().layoutLocation;
                if (ent2 == outVarMaps[preStage]->end() &&
                    location != glslang::TQualifier::layoutLocationEnd) {
                    for (auto var = outVarMaps[preStage]->begin(); var != ent2; var++) {
                        if (var->second.symbol->getType().getQualifier().layoutLocation == location) {
                            ent2 = var;
                            break;
                        }
                    }
                }
                if (ent2 != outVarMaps[preStage]->end()) {
                    auto& type1 = base->getType();
                    auto& type2 = ent2->second.symbol->getType();
                    hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(preStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }

                    if (mangleName1 == mangleName2) {
                        // For ES 3.0 only, other versions have no such restrictions
                        // According to ES 3.0 spec: The type and presence of the interpolation qualifiers and
                        // storage qualifiers  of variables with the same name declared in all linked shaders must
                        // match, otherwise the link command will fail.
                        if (profile == EEsProfile && version == 300) {
                            // Don't need to check smooth qualifier, as it uses the default interpolation mode
                            if (ent1.stage == EShLangFragment && type1.isBuiltIn() == false) {
                                if (type1.getQualifier().flat != type2.getQualifier().flat ||
                                    type1.getQualifier().nopersp != type2.getQualifier().nopersp) {
                                    TString err = "Interpolation qualifier mismatch : " + entKey.first;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                }
                            }
                        }
                        return;
                    }
                    else {
                        // Deal with input/output pairs where one is a block member but the other is loose,
                        // e.g. with ARB_separate_shader_objects
                        if (type1.getBasicType() == EbtBlock &&
                            type1.isStruct() && !type2.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type1.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName2
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        if (type2.getBasicType() == EbtBlock &&
                            type2.isStruct() && !type1.isStruct()) {
                            // Iterate through block members tracking layout
                            glslang::TString name;
                            type2.getStruct()->begin()->type->appendMangledName(name);
                            if (name == mangleName1
                                && type1.getQualifier().layoutLocation == type2.getQualifier().layoutLocation) return;
                        }
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                else if (!base->getType().isBuiltIn()) {
                    // According to spec: A link error is generated if any statically referenced input variable
                    // or block does not have a matching output
                    if (profile == EEsProfile && ent1.live) {
                        hadError = true;
                        TString errorStr = name + ": not been declare as a output variable in pre shader stage.";
                        infoSink.info.message(EPrefixError, errorStr.c_str());
                    }
                }
                return;
            }
        } else if (base->getQualifier().storage == EvqVaryingOut) {
            // validate stage out;
            if (nextStage == EShLangCount)
                return;
            if (TSymbolTable::isBuiltInSymbol(base->getId()))
                return;
            if (inVarMaps[nextStage] != nullptr) {
                auto ent2 = inVarMaps[nextStage]->find(name);
                if (ent2 != inVarMaps[nextStage]->end()) {
                    if (ent2->second.symbol->getType().getQualifier().isArrayedIo(nextStage)) {
                        TType subType(ent2->second.symbol->getType(), 0);
                        subType.appendMangledName(mangleName2);
                    } else {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                    }
                    if (mangleName1 == mangleName2)
                        return;
                    else {
                        TString err = "Invalid In/Out variable type : " + entKey.first;
                        infoSink.info.message(EPrefixInternalError, err.c_str());
                        hadError = true;
                    }
                }
                return;
            }
        } else if (base->getQualifier().isUniformOrBuffer() && !base->getQualifier().isPushConstant()) {
            // validate uniform type;
            for (int i = 0; i < EShLangCount; i++) {
                if (i != currentStage && outVarMaps[i] != nullptr) {
                    auto ent2 = uniformVarMap[i]->find(name);
                    if (ent2 != uniformVarMap[i]->end()) {
                        ent2->second.symbol->getType().appendMangledName(mangleName2);
                        if (mangleName1 != mangleName2) {
                            ent2->second.symbol->getType().sameElementType(type);
                            TString err = "Invalid Uniform variable type : " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }
                        mangleName2.clear();

                        // validate instance name of blocks
                        if (hadError == false &&
                            base->getType().getBasicType() == EbtBlock &&
                            IsAnonymous(base->getName()) != IsAnonymous(ent2->second.symbol->getName())) {
                            TString err = "Matched uniform block names must also either all be lacking "
                                          "an instance name or all having an instance name: " + entKey.first;
                            infoSink.info.message(EPrefixInternalError, err.c_str());
                            hadError = true;
                        }

                        // validate uniform block member qualifier and member names
                        auto& type1 = base->getType();
                        auto& type2 = ent2->second.symbol->getType();
                        if (hadError == false && base->getType().getBasicType() == EbtBlock) {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), true);
                        }
                        else {
                            hadError = hadError || typeCheck(&type1, &type2, name.c_str(), false);
                        }
                    }
                    else if (base->getBasicType() == EbtBlock)
                    {
                        if (IsAnonymous(base->getName()))
                        {
                            // The name of anonymous block member can't same with default uniform variable.
                            auto blockType1 = base->getType().getStruct();
                            for (size_t memberIdx = 0; memberIdx < blockType1->size(); ++memberIdx) {
                                auto memberName = (*blockType1)[memberIdx].type->getFieldName();
                                if (uniformVarMap[i]->find(memberName) != uniformVarMap[i]->end())
                                {
                                    TString err = "Invalid Uniform variable name : " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                        }
                    }
                }
            }
        }
    }